

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void tcg_x86_init_x86_64(uc_struct_conflict *uc)

{
  TCGContext *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i64 pTVar2;
  TCGContext *tcg_ctx;
  int i;
  uc_struct_conflict *uc_local;
  
  tcg_ctx_00 = uc->tcg_ctx;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0xa8,"cc_op");
  tcg_ctx_00->cpu_cc_op = pTVar1;
  pTVar2 = tcg_global_mem_new_i64(tcg_ctx_00,tcg_ctx_00->cpu_env,0x90,"cc_dst");
  tcg_ctx_00->cpu_cc_dst = pTVar2;
  pTVar2 = tcg_global_mem_new_i64(tcg_ctx_00,tcg_ctx_00->cpu_env,0x98,"cc_src");
  tcg_ctx_00->cpu_cc_src = pTVar2;
  pTVar2 = tcg_global_mem_new_i64(tcg_ctx_00,tcg_ctx_00->cpu_env,0xa0,"cc_src2");
  tcg_ctx_00->cpu_cc_src2 = pTVar2;
  for (tcg_ctx._4_4_ = 0; tcg_ctx._4_4_ < 0x10; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    pTVar2 = tcg_global_mem_new_i64
                       (tcg_ctx_00,tcg_ctx_00->cpu_env,(long)tcg_ctx._4_4_ << 3,
                        tcg_x86_init_x86_64::reg_names[tcg_ctx._4_4_]);
    tcg_ctx_00->cpu_regs[tcg_ctx._4_4_] = pTVar2;
  }
  for (tcg_ctx._4_4_ = 0; tcg_ctx._4_4_ < 6; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    pTVar2 = tcg_global_mem_new_i64
                       (tcg_ctx_00,tcg_ctx_00->cpu_env,(long)tcg_ctx._4_4_ * 0x18 + 0xc0,
                        tcg_x86_init_x86_64::seg_base_names[tcg_ctx._4_4_]);
    tcg_ctx_00->cpu_seg_base[tcg_ctx._4_4_] = pTVar2;
  }
  for (tcg_ctx._4_4_ = 0; tcg_ctx._4_4_ < 4; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    pTVar2 = tcg_global_mem_new_i64
                       (tcg_ctx_00,tcg_ctx_00->cpu_env,(long)tcg_ctx._4_4_ * 0x10 + 0x1d8,
                        tcg_x86_init_x86_64::bnd_regl_names[tcg_ctx._4_4_]);
    tcg_ctx_00->cpu_bndl[tcg_ctx._4_4_] = pTVar2;
    pTVar2 = tcg_global_mem_new_i64
                       (tcg_ctx_00,tcg_ctx_00->cpu_env,(long)tcg_ctx._4_4_ * 0x10 + 0x1e0,
                        tcg_x86_init_x86_64::bnd_regu_names[tcg_ctx._4_4_]);
    tcg_ctx_00->cpu_bndu[tcg_ctx._4_4_] = pTVar2;
  }
  return;
}

Assistant:

void tcg_x86_init(struct uc_struct *uc)
{
    static const char reg_names[CPU_NB_REGS][4] = {
#ifdef TARGET_X86_64
        [R_EAX] = "rax",
        [R_EBX] = "rbx",
        [R_ECX] = "rcx",
        [R_EDX] = "rdx",
        [R_ESI] = "rsi",
        [R_EDI] = "rdi",
        [R_EBP] = "rbp",
        [R_ESP] = "rsp",
        [8]  = "r8",
        [9]  = "r9",
        [10] = "r10",
        [11] = "r11",
        [12] = "r12",
        [13] = "r13",
        [14] = "r14",
        [15] = "r15",
#else
        [R_EAX] = "eax",
        [R_EBX] = "ebx",
        [R_ECX] = "ecx",
        [R_EDX] = "edx",
        [R_ESI] = "esi",
        [R_EDI] = "edi",
        [R_EBP] = "ebp",
        [R_ESP] = "esp",
#endif
    };
    static const char seg_base_names[6][8] = {
        [R_CS] = "cs_base",
        [R_DS] = "ds_base",
        [R_ES] = "es_base",
        [R_FS] = "fs_base",
        [R_GS] = "gs_base",
        [R_SS] = "ss_base",
    };
    static const char bnd_regl_names[4][8] = {
        "bnd0_lb", "bnd1_lb", "bnd2_lb", "bnd3_lb"
    };
    static const char bnd_regu_names[4][8] = {
        "bnd0_ub", "bnd1_ub", "bnd2_ub", "bnd3_ub"
    };
    int i;
    TCGContext *tcg_ctx = uc->tcg_ctx;

    tcg_ctx->cpu_cc_op = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env,
                                       offsetof(CPUX86State, cc_op), "cc_op");
    tcg_ctx->cpu_cc_dst = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUX86State, cc_dst),
                                    "cc_dst");
    tcg_ctx->cpu_cc_src = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUX86State, cc_src),
                                    "cc_src");
    tcg_ctx->cpu_cc_src2 = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPUX86State, cc_src2),
                                     "cc_src2");

    for (i = 0; i < CPU_NB_REGS; ++i) {
        tcg_ctx->cpu_regs[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
                                         offsetof(CPUX86State, regs[i]),
                                         reg_names[i]);
    }

    for (i = 0; i < 6; ++i) {
        tcg_ctx->cpu_seg_base[i]
            = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
                                 offsetof(CPUX86State, segs[i].base),
                                 seg_base_names[i]);
    }

    for (i = 0; i < 4; ++i) {
        tcg_ctx->cpu_bndl[i]
            = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
                                     offsetof(CPUX86State, bnd_regs[i].lb),
                                     bnd_regl_names[i]);
        tcg_ctx->cpu_bndu[i]
            = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
                                     offsetof(CPUX86State, bnd_regs[i].ub),
                                     bnd_regu_names[i]);
    }
}